

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O3

void __thiscall CBlacklist::Init(CBlacklist *this)

{
  Init((CBlacklist *)&this[-1].super_IContactList.m_aContacts[0x7f].m_NameHash);
  return;
}

Assistant:

void CBlacklist::Init()
{
	IConfigManager *pConfigManager = Kernel()->RequestInterface<IConfigManager>();
	if(pConfigManager)
		pConfigManager->RegisterCallback(ConfigSaveCallback, this);

	IConsole *pConsole = Kernel()->RequestInterface<IConsole>();
	if(pConsole)
	{
		pConsole->Register("add_ignore", "s[name] s[clan]", CFGFLAG_CLIENT, ConAddIgnore, this, "Ignore a player");
		pConsole->Register("remove_ignore", "s[name] s[clan]", CFGFLAG_CLIENT, ConRemoveIgnore, this, "Stop ignoring a player");
	}
}